

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# has_correlated_expressions.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::HasCorrelatedExpressions::VisitReplace
          (HasCorrelatedExpressions *this,BoundSubqueryExpression *expr,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_ptr)

{
  long *plVar1;
  pointer pCVar2;
  pointer pCVar3;
  Binder *pBVar4;
  const_reference pvVar5;
  __normal_iterator<duckdb::CorrelatedColumnInfo_*,_std::vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>_>
  _Var6;
  size_type __n;
  shared_ptr<duckdb::Binder,_true> *this_00;
  
  this_00 = (shared_ptr<duckdb::Binder,_true> *)(expr_ptr + 0xb);
  pBVar4 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
  if (((pBVar4->correlated_columns).
       super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
       super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (pBVar4->correlated_columns).
       super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
       super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (plVar1 = (long *)(expr->super_Expression).super_BaseExpression.alias._M_dataplus._M_p,
     plVar1[1] != *plVar1)) {
    __n = 0;
    do {
      pBVar4 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
      pCVar2 = (pBVar4->correlated_columns).
               super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
               .
               super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pBVar4 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
      pCVar3 = (pBVar4->correlated_columns).
               super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
               .
               super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pvVar5 = vector<duckdb::CorrelatedColumnInfo,_true>::operator[]
                         ((vector<duckdb::CorrelatedColumnInfo,_true> *)
                          (expr->super_Expression).super_BaseExpression.alias._M_dataplus._M_p,__n);
      _Var6 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<duckdb::CorrelatedColumnInfo*,std::vector<duckdb::CorrelatedColumnInfo,std::allocator<duckdb::CorrelatedColumnInfo>>>,__gnu_cxx::__ops::_Iter_equals_val<duckdb::CorrelatedColumnInfo_const>>
                        (pCVar2,pCVar3,pvVar5);
      pBVar4 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
      if (_Var6._M_current !=
          (pBVar4->correlated_columns).
          super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
          super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        (expr->super_Expression).super_BaseExpression.type = 1;
        break;
      }
      plVar1 = (long *)(expr->super_Expression).super_BaseExpression.alias._M_dataplus._M_p;
      __n = __n + 1;
    } while (__n < (ulong)((plVar1[1] - *plVar1 >> 4) * -0x3333333333333333));
  }
  (this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor = (_func_int **)0x0;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> HasCorrelatedExpressions::VisitReplace(BoundSubqueryExpression &expr,
                                                              unique_ptr<Expression> *expr_ptr) {
	if (!expr.IsCorrelated()) {
		return nullptr;
	}
	// check if the subquery contains any of the correlated expressions that we are concerned about in this node
	for (idx_t i = 0; i < correlated_columns.size(); i++) {
		if (std::find(expr.binder->correlated_columns.begin(), expr.binder->correlated_columns.end(),
		              correlated_columns[i]) != expr.binder->correlated_columns.end()) {
			has_correlated_expressions = true;
			break;
		}
	}
	return nullptr;
}